

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppArgs.cpp
# Opt level: O0

bool __thiscall AppArgs::Parse(AppArgs *this,int argc,char **argv)

{
  uint uVar1;
  ulong uVar2;
  int val;
  char *optstring;
  char *end;
  int opt_index;
  int opt;
  char **argv_local;
  AppArgs *pAStack_18;
  int argc_local;
  AppArgs *this_local;
  
  this->mLongOptions[this->mNumLongOptions].name = (char *)0x0;
  this->mLongOptions[this->mNumLongOptions].has_arg = 0;
  this->mLongOptions[this->mNumLongOptions].flag = (int *)0x0;
  this->mLongOptions[this->mNumLongOptions].val = 0;
  _optind = 0;
  _opt_index = argv;
  argv_local._4_4_ = argc;
  pAStack_18 = this;
  do {
    end._4_4_ = getopt_long_only(argv_local._4_4_,_opt_index,"",this->mLongOptions,&end);
    if (end._4_4_ == -1) {
      this->mParamIndex = _optind;
    }
    else {
      if (end._4_4_ != 0) {
        (*this->_vptr_AppArgs[5])(this,*_opt_index);
        return false;
      }
      if (((int)end < this->mNumLongOptions) && ((this->mOptionData[(int)end].numeric & 1U) != 0)) {
        uVar2 = strtol(_optarg,&optstring,0);
        if (*optstring != '\0') {
          (*this->_vptr_AppArgs[5])(this,*_opt_index);
          return false;
        }
        uVar1 = (*this->_vptr_AppArgs[4])(this,(ulong)(uint)this->mKey,uVar2 & 0xffffffff);
        if ((uVar1 & 1) == 0) {
          (*this->_vptr_AppArgs[5])(this,*_opt_index);
          return false;
        }
      }
      else {
        uVar1 = (*this->_vptr_AppArgs[3])(this,(ulong)(uint)this->mKey,_optarg);
        if ((uVar1 & 1) == 0) {
          (*this->_vptr_AppArgs[5])(this,*_opt_index);
          return false;
        }
      }
    }
    if (end._4_4_ < 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool AppArgs::Parse( int argc, const char *argv[] )
{
	int opt, opt_index;
	char* end;
	const char *optstring;
	
	mLongOptions[ mNumLongOptions ].name = NULL;
	mLongOptions[ mNumLongOptions ].has_arg = 0;
	mLongOptions[ mNumLongOptions ].flag = NULL;
	mLongOptions[ mNumLongOptions ].val = 0;

	optstring = "";
	optind = 0;
	
	do
	{
		opt = getopt_long_only( argc, const_cast<char * const*>( argv ), optstring, mLongOptions, &opt_index );

		switch (opt)
		{
			case 0:
				if ( opt_index < mNumLongOptions && mOptionData[ opt_index ].numeric )
				{
					int val = strtol( optarg, &end, 0 );
					if ( *end != 0 )
					{
						usage( argv[ 0 ] );
						return false;
					}
					if ( handleParam( mKey, val ) == false )
					{
						usage( argv[ 0 ] );
						return false;
					}	
				}
				else
				{
					if ( handleParam( mKey, optarg ) == false )
					{
						usage( argv[ 0 ] );
						return false;
					}
				}
				break;
			
			case -1:
				mParamIndex = optind;
				break;
						
			case ':':
			case '?':
			default:
				usage( argv[ 0 ] );
				return false;				
		}
	} while( opt >= 0 );

	return true;
}